

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

void StoreMaxDelta(VP8SegmentInfo *dqm,int16_t *DCs)

{
  int iVar1;
  int local_28;
  int local_24;
  int max_v;
  int v2;
  int v1;
  int v0;
  int16_t *DCs_local;
  VP8SegmentInfo *dqm_local;
  
  local_24 = (int)DCs[1];
  if (local_24 < 1) {
    local_24 = -local_24;
  }
  iVar1 = (int)DCs[2];
  if (iVar1 < 1) {
    iVar1 = -iVar1;
  }
  local_28 = (int)DCs[4];
  if (local_28 < 1) {
    local_28 = -local_28;
  }
  if (local_24 < iVar1) {
    local_24 = iVar1;
  }
  if (local_28 <= local_24) {
    local_28 = local_24;
  }
  if (dqm->max_edge < local_28) {
    dqm->max_edge = local_28;
  }
  return;
}

Assistant:

static void StoreMaxDelta(VP8SegmentInfo* const dqm, const int16_t DCs[16]) {
  // We look at the first three AC coefficients to determine what is the average
  // delta between each sub-4x4 block.
  const int v0 = abs(DCs[1]);
  const int v1 = abs(DCs[2]);
  const int v2 = abs(DCs[4]);
  int max_v = (v1 > v0) ? v1 : v0;
  max_v = (v2 > max_v) ? v2 : max_v;
  if (max_v > dqm->max_edge) dqm->max_edge = max_v;
}